

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cmCryptoHash::Finalize
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cmCryptoHash *this)

{
  rhash ctx;
  int iVar1;
  reference first_result;
  allocator<unsigned_char> local_1b;
  value_type_conflict4 local_1a [2];
  cmCryptoHash *local_18;
  cmCryptoHash *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash;
  
  local_1a[1] = 0;
  local_18 = this;
  this_local = (cmCryptoHash *)__return_storage_ptr__;
  iVar1 = rhash_get_digest_size(this->Id);
  local_1a[0] = '\0';
  std::allocator<unsigned_char>::allocator(&local_1b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)iVar1,local_1a,&local_1b);
  std::allocator<unsigned_char>::~allocator(&local_1b);
  ctx = this->CTX;
  first_result = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (__return_storage_ptr__,0);
  rhash_final(ctx,first_result);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> cmCryptoHash::Finalize()
{
  std::vector<unsigned char> hash(rhash_get_digest_size(this->Id), 0);
  rhash_final(this->CTX, &hash[0]);
  return hash;
}